

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64_t *value,uint64_t max_value)

{
  bool bVar1;
  string_view message;
  string_view message_00;
  undefined1 local_c0 [32];
  AlphaNum local_a0;
  AlphaNum local_70;
  AlphaNum local_40;
  
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    bVar1 = io::Tokenizer::ParseInteger(&(this->tokenizer_).current_.text,max_value,value);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      return true;
    }
    local_40.piece_._M_len = 0x16;
    local_40.piece_._M_str = "Integer out of range (";
    local_70.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_70.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    local_a0.piece_._M_len = 1;
    local_a0.piece_._M_str = ")";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c0,&local_40,&local_70);
    message_00._M_str = (char *)local_c0._0_8_;
    message_00._M_len = local_c0._8_8_;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message_00)
    ;
    local_a0.digits_._0_8_ = local_c0._16_8_;
    if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
      return false;
    }
  }
  else {
    local_40.piece_._M_len = 0x17;
    local_40.piece_._M_str = "Expected integer, got: ";
    local_70.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_70.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_(&local_a0,&local_40);
    message._M_str = (char *)local_a0.piece_._M_len;
    message._M_len = (size_t)local_a0.piece_._M_str;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    local_c0._0_8_ = local_a0.piece_._M_len;
    if ((char *)local_a0.piece_._M_len == local_a0.digits_) {
      return false;
    }
  }
  operator_delete((void *)local_c0._0_8_,local_a0.digits_._0_8_ + 1);
  return false;
}

Assistant:

bool ConsumeUnsignedInteger(uint64_t* value, uint64_t max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError(
          absl::StrCat("Expected integer, got: ", tokenizer_.current().text));
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text, max_value,
                                     value)) {
      ReportError(absl::StrCat("Integer out of range (",
                               tokenizer_.current().text, ")"));
      return false;
    }

    tokenizer_.Next();
    return true;
  }